

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

int __thiscall flecs::system<>::system(system<> *this,char *__command)

{
  char *in_RCX;
  char *in_RDX;
  char *signature_local;
  char *name_local;
  world *world_local;
  system<> *this_local;
  
  flecs::entity::entity(&this->super_entity,(world *)__command,in_RDX,false);
  this->m_kind = 0x111;
  this->m_signature = in_RCX;
  this->m_interval = 0.0;
  this->m_on_demand = false;
  this->m_hidden = false;
  this->m_finalized = false;
  _ecs_assert((this->super_entity).m_id != 0,0xc,(char *)0x0,"m_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0x11a5);
  if ((this->super_entity).m_id != 0) {
    return (int)this;
  }
  __assert_fail("m_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0x11a5,
                "flecs::system<>::system(const flecs::world &, const char *, const char *) [Components = <>]"
               );
}

Assistant:

explicit system(const flecs::world& world, const char *name = nullptr, const char *signature = nullptr) 
        : entity(world, name)
        , m_kind(static_cast<ecs_entity_t>(OnUpdate)) 
        , m_signature(signature)
        , m_interval(0.0)
        , m_on_demand(false)
        , m_hidden(false)
        , m_finalized(false) { 
            ecs_assert(m_id != 0, ECS_INTERNAL_ERROR, NULL);
        }